

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

bool __thiscall GenCADFile::parse_components(GenCADFile *this)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  long in_RDI;
  bool flip;
  mpc_ast_t *flip_ast;
  bool mirror_y;
  bool mirror_x;
  mpc_ast_t *mirror_ast;
  mpc_ast_t *shape_ast;
  char *shape_name_str;
  mpc_ast_t *shape_ref_ast;
  char *dev_name;
  mpc_ast_t *component_device_ast;
  mpc_ast_t *layer_index_ast;
  mpc_ast_t *layer_ast;
  mpc_ast_t *rotation_value_ast;
  mpc_ast_t *rotation_ast;
  double component_rotation_angle;
  mpc_ast_t *pos_ast;
  mpc_ast_t *place_ast;
  char *component_name;
  BRDPart brd_part;
  mpc_ast_t *component_ast;
  int i;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  mpc_ast_t *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  GenCADFile *in_stack_fffffffffffffe80;
  GenCADFile *in_stack_fffffffffffffe88;
  BRDPart *in_stack_fffffffffffffe90;
  GenCADFile *in_stack_fffffffffffffe98;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar5;
  GenCADFile *pGVar6;
  GenCADFile *rotation_in_degrees;
  BRDPart *part;
  GenCADFile *this_00;
  char local_c2 [2];
  char *local_c0;
  mpc_ast_t *local_b8;
  mpc_ast_t *local_b0;
  mpc_ast_t *local_a8;
  mpc_ast_t *local_a0;
  mpc_ast_t *local_98;
  double local_90;
  mpc_ast_t *local_88;
  mpc_ast_t *local_80;
  char *local_68;
  char *local_60;
  string local_58 [32];
  undefined4 local_38;
  uint local_34;
  int local_30;
  mpc_ast_t *local_18;
  int local_c;
  
  fill_signals_cache((GenCADFile *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  local_c = 0;
  while (-1 < local_c) {
    local_c = mpc_ast_get_index_lb
                        ((mpc_ast_t *)
                         CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                         (char *)in_stack_fffffffffffffe70,
                         CONCAT13(in_stack_fffffffffffffe6f,
                                  CONCAT12(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c)));
    if (-1 < local_c) {
      local_18 = mpc_ast_get_child_lb
                           ((mpc_ast_t *)
                            CONCAT17(in_stack_fffffffffffffe7f,
                                     CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                            (char *)in_stack_fffffffffffffe70,
                            CONCAT13(in_stack_fffffffffffffe6f,
                                     CONCAT12(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c)))
      ;
      BRDPart::BRDPart((BRDPart *)in_stack_fffffffffffffe80);
      local_68 = get_nonquoted_or_quoted_string_child
                           (in_stack_fffffffffffffe88,(mpc_ast_t *)in_stack_fffffffffffffe80,
                            (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                             CONCAT16(in_stack_fffffffffffffe7e,
                                                      in_stack_fffffffffffffe78)));
      if (local_68 != (char *)0x0) {
        local_60 = local_68;
      }
      local_80 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                   (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                    CONCAT16(in_stack_fffffffffffffe6e,
                                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                                      in_stack_fffffffffffffe68))));
      if ((local_80 != (mpc_ast_t *)0x0) &&
         (local_88 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                       (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                        CONCAT16(in_stack_fffffffffffffe6e,
                                                                 CONCAT24(in_stack_fffffffffffffe6c,
                                                                          in_stack_fffffffffffffe68)
                                                                ))), local_88 != (mpc_ast_t *)0x0))
      {
        x_y_ref_to_brd_point
                  ((GenCADFile *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                   in_stack_fffffffffffffe70,
                   (BRDPoint *)
                   CONCAT17(in_stack_fffffffffffffe6f,
                            CONCAT16(in_stack_fffffffffffffe6e,
                                     CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)))
                  );
        x_y_ref_to_brd_point
                  ((GenCADFile *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                   in_stack_fffffffffffffe70,
                   (BRDPoint *)
                   CONCAT17(in_stack_fffffffffffffe6f,
                            CONCAT16(in_stack_fffffffffffffe6e,
                                     CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)))
                  );
      }
      local_90 = 0.0;
      local_98 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                   (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                    CONCAT16(in_stack_fffffffffffffe6e,
                                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                                      in_stack_fffffffffffffe68))));
      local_a0 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                   (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                    CONCAT16(in_stack_fffffffffffffe6e,
                                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                                      in_stack_fffffffffffffe68))));
      if ((local_98 != (mpc_ast_t *)0x0) && (local_a0 != (mpc_ast_t *)0x0)) {
        local_90 = atof(local_a0->contents);
      }
      local_a8 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                   (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                    CONCAT16(in_stack_fffffffffffffe6e,
                                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                                      in_stack_fffffffffffffe68))));
      if (local_a8 != (mpc_ast_t *)0x0) {
        local_b0 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                     (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                      CONCAT16(in_stack_fffffffffffffe6e,
                                                               CONCAT24(in_stack_fffffffffffffe6c,
                                                                        in_stack_fffffffffffffe68)))
                                    );
        bVar1 = has_text_content(in_stack_fffffffffffffe80,
                                 (mpc_ast_t *)
                                 CONCAT17(in_stack_fffffffffffffe7f,
                                          CONCAT16(in_stack_fffffffffffffe7e,
                                                   in_stack_fffffffffffffe78)),
                                 (char *)in_stack_fffffffffffffe70);
        if (bVar1) {
          local_38 = 2;
        }
        else {
          bVar1 = has_text_content(in_stack_fffffffffffffe80,
                                   (mpc_ast_t *)
                                   CONCAT17(in_stack_fffffffffffffe7f,
                                            CONCAT16(in_stack_fffffffffffffe7e,
                                                     in_stack_fffffffffffffe78)),
                                   (char *)in_stack_fffffffffffffe70);
          if (bVar1) {
            local_38 = 1;
          }
        }
      }
      local_b8 = mpc_ast_get_child(in_stack_fffffffffffffe70,
                                   (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                    CONCAT16(in_stack_fffffffffffffe6e,
                                                             CONCAT24(in_stack_fffffffffffffe6c,
                                                                      in_stack_fffffffffffffe68))));
      if (local_b8 != (mpc_ast_t *)0x0) {
        __s = get_stringtoend_child
                        (in_stack_fffffffffffffe98,(mpc_ast_t *)in_stack_fffffffffffffe90,
                         (char *)in_stack_fffffffffffffe88);
        local_c0 = __s;
        sVar2 = strlen(__s);
        local_c2[1] = 0x20;
        local_c2[0] = '_';
        std::replace<char*,char>(__s,__s + sVar2,local_c2 + 1,local_c2);
        if (local_c0 != (char *)0x0) {
          std::__cxx11::string::operator=(local_58,local_c0);
        }
      }
      in_stack_fffffffffffffe98 =
           (GenCADFile *)
           mpc_ast_get_child(in_stack_fffffffffffffe70,
                             (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                              CONCAT16(in_stack_fffffffffffffe6e,
                                                       CONCAT24(in_stack_fffffffffffffe6c,
                                                                in_stack_fffffffffffffe68))));
      if (((in_stack_fffffffffffffe98 != (GenCADFile *)0x0) &&
          (this_00 = in_stack_fffffffffffffe98,
          in_stack_fffffffffffffe90 =
               (BRDPart *)
               get_nonquoted_or_quoted_string_child
                         (in_stack_fffffffffffffe88,(mpc_ast_t *)in_stack_fffffffffffffe80,
                          (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                           CONCAT16(in_stack_fffffffffffffe7e,
                                                    in_stack_fffffffffffffe78))),
          in_stack_fffffffffffffe90 != (BRDPart *)0x0)) &&
         (*(char *)&in_stack_fffffffffffffe90->name != '\0')) {
        part = in_stack_fffffffffffffe90;
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::operator+=(local_58," SHAPE ");
        }
        std::__cxx11::string::operator+=(local_58,(char *)part);
        in_stack_fffffffffffffe88 =
             (GenCADFile *)
             get_shape_by_name(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
        if (in_stack_fffffffffffffe88 != (GenCADFile *)0x0) {
          rotation_in_degrees = in_stack_fffffffffffffe88;
          in_stack_fffffffffffffe80 =
               (GenCADFile *)
               mpc_ast_get_child(in_stack_fffffffffffffe70,
                                 (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                  CONCAT16(in_stack_fffffffffffffe6e,
                                                           CONCAT24(in_stack_fffffffffffffe6c,
                                                                    in_stack_fffffffffffffe68))));
          pGVar6 = in_stack_fffffffffffffe80;
          in_stack_fffffffffffffe7f =
               has_text_content(in_stack_fffffffffffffe80,
                                (mpc_ast_t *)
                                CONCAT17(in_stack_fffffffffffffe7f,
                                         CONCAT16(in_stack_fffffffffffffe7e,
                                                  in_stack_fffffffffffffe78)),
                                (char *)in_stack_fffffffffffffe70);
          uVar5 = in_stack_fffffffffffffe7f;
          in_stack_fffffffffffffe7e =
               has_text_content(in_stack_fffffffffffffe80,
                                (mpc_ast_t *)
                                CONCAT17(in_stack_fffffffffffffe7f,
                                         CONCAT16(in_stack_fffffffffffffe7e,
                                                  in_stack_fffffffffffffe78)),
                                (char *)in_stack_fffffffffffffe70);
          uVar4 = in_stack_fffffffffffffe7e;
          in_stack_fffffffffffffe70 =
               mpc_ast_get_child(in_stack_fffffffffffffe70,
                                 (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                                  CONCAT16(in_stack_fffffffffffffe6e,
                                                           CONCAT24(in_stack_fffffffffffffe6c,
                                                                    in_stack_fffffffffffffe68))));
          in_stack_fffffffffffffe6f =
               has_text_content(in_stack_fffffffffffffe80,
                                (mpc_ast_t *)
                                CONCAT17(in_stack_fffffffffffffe7f,
                                         CONCAT16(in_stack_fffffffffffffe7e,
                                                  in_stack_fffffffffffffe78)),
                                (char *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe6e =
               is_shape_smd(in_stack_fffffffffffffe98,(mpc_ast_t *)in_stack_fffffffffffffe90);
          local_34 = (byte)~in_stack_fffffffffffffe6e & 1;
          parse_shape_pins_to_component
                    (this_00,part,(double)rotation_in_degrees,SUB81((ulong)pGVar6 >> 0x38,0),
                     SUB81((ulong)pGVar6 >> 0x30,0),SUB81((ulong)pGVar6 >> 0x28,0),
                     (mpc_ast_t *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff10)));
          if (local_34 == 1) {
            local_38 = 0;
          }
          local_30 = *(int *)(in_RDI + 0x10) + -1;
        }
      }
      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffffe80,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)));
      *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
      local_c = local_c + 1;
      BRDPart::~BRDPart((BRDPart *)0x18bfb3);
    }
  }
  return true;
}

Assistant:

bool GenCADFile::parse_components() {
	fill_signals_cache();
	for (int i = 0; i >= 0;) {
		i = mpc_ast_get_index_lb(components_ast, "component|>", i);
		if (i >= 0) {
			mpc_ast_t *component_ast = mpc_ast_get_child_lb(components_ast, "component|>", i);

			BRDPart brd_part;
			char *component_name = get_nonquoted_or_quoted_string_child(component_ast, "component_name");
			if (component_name) {
				brd_part.name = component_name;
			}

			mpc_ast_t *place_ast = mpc_ast_get_child(component_ast, "place|>");
			if (place_ast) {
				mpc_ast_t *pos_ast = mpc_ast_get_child(place_ast, "x_y_ref|>");
				if (pos_ast) {
					x_y_ref_to_brd_point(pos_ast, &brd_part.p1);
					x_y_ref_to_brd_point(pos_ast, &brd_part.p2);
				}
			}

			double component_rotation_angle = 0.0;
			mpc_ast_t *rotation_ast         = mpc_ast_get_child(component_ast, "rotation|>");
			mpc_ast_t *rotation_value_ast   = mpc_ast_get_child(rotation_ast, "rot|number|regex");
			if (rotation_ast && rotation_value_ast) {
				component_rotation_angle = atof(rotation_value_ast->contents);
			}

			mpc_ast_t *layer_ast = mpc_ast_get_child(component_ast, "named_layer|>");
			if (layer_ast) {
				mpc_ast_t *layer_index_ast = mpc_ast_get_child(layer_ast, "layer_name|nonquoted_string|regex");
				if (has_text_content(layer_index_ast, "TOP")) {
					brd_part.mounting_side = BRDPartMountingSide::Top;
				} else if (has_text_content(layer_index_ast, "BOTTOM")) {
					brd_part.mounting_side = BRDPartMountingSide::Bottom;
				}
			}

			mpc_ast_t *component_device_ast = mpc_ast_get_child(component_ast, "device_|>");
			if (component_device_ast) {
				char *dev_name = get_stringtoend_child(component_device_ast, "device_name");
				// workaround for RSI-TRANSLATOR CAMCAD bad COMPONENT -> DEVICE references
				std::replace(dev_name, dev_name + strlen(dev_name), ' ', '_');
				if (dev_name) brd_part.mfgcode = dev_name;
			}

			mpc_ast_t *shape_ref_ast = mpc_ast_get_child(component_ast, "shape_|>");
			if (shape_ref_ast) {
				char *shape_name_str = get_nonquoted_or_quoted_string_child(shape_ref_ast, "shape_name");
				if (shape_name_str && *shape_name_str) {
					if (!brd_part.mfgcode.empty()) {
						brd_part.mfgcode += " SHAPE ";
					}
					brd_part.mfgcode += shape_name_str;
					mpc_ast_t *shape_ast = get_shape_by_name(shape_name_str);
					if (shape_ast) {
						mpc_ast_t *mirror_ast = mpc_ast_get_child(shape_ref_ast, "mirror|string");
						bool mirror_x         = has_text_content(mirror_ast, "MIRRORX");
						bool mirror_y         = has_text_content(mirror_ast, "MIRRORY");
						mpc_ast_t *flip_ast   = mpc_ast_get_child(shape_ref_ast, "flip|string");
						bool flip             = has_text_content(flip_ast, "FLIP");
						brd_part.part_type    = is_shape_smd(shape_ast) ? BRDPartType::SMD : BRDPartType::ThroughHole;
						parse_shape_pins_to_component(&brd_part, component_rotation_angle, mirror_x, mirror_y, flip, shape_ast);
						if ( brd_part.part_type == BRDPartType::ThroughHole ) {
							brd_part.mounting_side = BRDPartMountingSide::Both;
						}
						brd_part.end_of_pins = num_pins - 1;
					}
				}
			}
			parts.push_back(brd_part);
			num_parts++;
			i++;
		}
	}
	return true;
}